

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

bool __thiscall
QPDFWriter::willFilterStream
          (QPDFWriter *this,QPDFObjectHandle *stream,bool *compress_stream,bool *is_root_metadata,
          string *stream_data)

{
  Count *p;
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  size_type sVar4;
  const_iterator pbVar5;
  qpdf_stream_decode_level_e local_290;
  qpdf_stream_decode_level_e local_28c;
  uint local_284;
  bool local_25d;
  bool local_259;
  bool local_24a;
  runtime_error *e;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_130;
  undefined1 local_128 [8];
  PipelinePopper pp_stream_data;
  bool first_attempt;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<bool> local_f8;
  initializer_list<bool> *local_e8;
  initializer_list<bool> *__range1;
  undefined1 local_d8 [4];
  bool filtered;
  bool uncompress;
  bool normalize;
  byte local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  QPDFObjectHandle filter_obj;
  bool filter_on_write;
  bool filter;
  undefined1 local_48 [8];
  QPDFObjectHandle stream_dict;
  QPDFObjGen old_og;
  string *stream_data_local;
  bool *is_root_metadata_local;
  bool *compress_stream_local;
  QPDFObjectHandle *stream_local;
  QPDFWriter *this_local;
  
  *compress_stream = false;
  *is_root_metadata = false;
  stream_dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)QPDFObjectHandle::getObjGen(stream);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_48);
  bVar2 = QPDFObjectHandle::isRootMetadata(stream);
  if (bVar2) {
    *is_root_metadata = true;
  }
  bVar2 = QPDFObjectHandle::isDataModified(stream);
  local_24a = true;
  if (!bVar2) {
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_24a = true;
    if ((peVar3->compress_streams & 1U) == 0) {
      peVar3 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      local_24a = peVar3->stream_decode_level != qpdf_dl_none;
    }
  }
  filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = local_24a;
  filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._2_1_ = QPDFObjectHandle::getFilterOnWrite(stream);
  if (!(bool)filter_obj.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._2_1_) {
    QTC::TC("qpdf","QPDFWriter getFilterOnWrite false",0);
    filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 0;
  }
  if (((filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._2_1_ & 1) != 0) &&
     (peVar3 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this), (peVar3->compress_streams & 1U) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_88,"/Filter",&local_89);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_68,(string *)local_48);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_b1 = 0;
    __range1._7_1_ = 0;
    local_259 = false;
    if ((peVar3->recompress_flate & 1U) == 0) {
      bVar2 = QPDFObjectHandle::isDataModified(stream);
      local_259 = false;
      if (!bVar2) {
        bVar2 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_68);
        local_259 = false;
        if (bVar2) {
          QPDFObjectHandle::getName_abi_cxx11_(&local_b0,(QPDFObjectHandle *)local_68);
          local_b1 = 1;
          bVar2 = std::operator==(&local_b0,"/FlateDecode");
          local_25d = true;
          if (!bVar2) {
            QPDFObjectHandle::getName_abi_cxx11_((string *)local_d8,(QPDFObjectHandle *)local_68);
            __range1._7_1_ = 1;
            local_25d = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_d8,"/Fl");
          }
          local_259 = local_25d;
        }
      }
    }
    if ((__range1._7_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)local_d8);
    }
    if ((local_b1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if (local_259 != false) {
      QTC::TC("qpdf","QPDFWriter not recompressing /FlateDecode",0);
      filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._3_1_ = 0;
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_68);
  }
  __range1._6_1_ = 0;
  __range1._5_1_ = 0;
  if ((((filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._2_1_ & 1) == 0) || ((*is_root_metadata & 1U) == 0)) ||
     ((peVar3 = std::
                __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this), (peVar3->encrypted & 1U) != 0 &&
      (peVar3 = std::
                __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this), (peVar3->encrypt_metadata & 1U) != 0)))) {
    if (((filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._2_1_ & 1) != 0) &&
       (peVar3 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this), (peVar3->normalize_content & 1U) != 0)) {
      peVar3 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      sVar4 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                        (&peVar3->normalized_streams,
                         (key_type *)
                         &stream_dict.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (sVar4 != 0) {
        __range1._6_1_ = 1;
        filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._3_1_ = 1;
        goto LAB_003180b7;
      }
    }
    if ((((filter_obj.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._2_1_ & 1)
          != 0) &&
        ((filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._3_1_ & 1) != 0)) &&
       (peVar3 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this), (peVar3->compress_streams & 1U) != 0)) {
      *compress_stream = true;
      QTC::TC("qpdf","QPDFWriter compressing uncompressed stream",0);
    }
  }
  else {
    QTC::TC("qpdf","QPDFWriter not compressing metadata",0);
    filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 1;
    *compress_stream = false;
    __range1._5_1_ = 1;
  }
LAB_003180b7:
  __range1._4_1_ = 0;
  __begin1._6_1_ = 1;
  __begin1._7_1_ = 0;
  local_f8._M_array = (iterator)((long)&__begin1 + 6);
  local_f8._M_len = 2;
  local_e8 = &local_f8;
  __end1 = std::initializer_list<bool>::begin(local_e8);
  pbVar5 = std::initializer_list<bool>::end(local_e8);
  for (; __end1 != pbVar5; __end1 = __end1 + 1) {
    pp_stream_data.stack_id._7_1_ = *__end1 & 1;
    PipelinePopper::PipelinePopper((PipelinePopper *)local_128,this);
    if (stream_data == (string *)0x0) {
      std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>::
      unique_ptr<std::default_delete<qpdf::pl::Link>,void>
                ((unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>> *)&local_130,
                 (nullptr_t)0x0);
      activatePipelineStack(this,(PipelinePopper *)local_128,true,(string *)0x0,&local_130);
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_130)
      ;
    }
    else {
      activatePipelineStack(this,(PipelinePopper *)local_128,stream_data);
    }
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    p = peVar3->pipeline;
    if ((filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._3_1_ & 1) == 0) {
      local_284 = 0;
    }
    else {
      local_284 = 0;
      if ((__range1._6_1_ & 1) != 0) {
        local_284 = 2;
      }
      local_284 = local_284 | (*compress_stream & 1U) != 0;
    }
    if ((filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._3_1_ & 1) == 0) {
      local_28c = qpdf_dl_none;
    }
    else {
      if ((__range1._5_1_ & 1) == 0) {
        peVar3 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        local_290 = peVar3->stream_decode_level;
      }
      else {
        local_290 = qpdf_dl_all;
      }
      local_28c = local_290;
    }
    __range1._4_1_ =
         QPDFObjectHandle::pipeStreamData
                   (stream,&p->super_Pipeline,local_284,local_28c,false,
                    (bool)(pp_stream_data.stack_id._7_1_ & 1));
    if (((filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._3_1_ & 1) == 0) || ((bool)__range1._4_1_)) {
      bVar2 = true;
    }
    else {
      filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._3_1_ = 0;
      QPDFObjectHandle::setFilterOnWrite(stream,false);
      if (stream_data != (string *)0x0) {
        std::__cxx11::string::clear();
      }
      bVar2 = false;
    }
    PipelinePopper::~PipelinePopper((PipelinePopper *)local_128);
    if ((bVar2) && (bVar2)) break;
  }
  bVar1 = __range1._4_1_;
  if ((__range1._4_1_ & 1) == 0) {
    *compress_stream = false;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  return (bool)(bVar1 & 1);
}

Assistant:

bool
QPDFWriter::willFilterStream(
    QPDFObjectHandle stream,
    bool& compress_stream,  // out only
    bool& is_root_metadata, // out only
    std::string* stream_data)
{
    compress_stream = false;
    is_root_metadata = false;

    QPDFObjGen old_og = stream.getObjGen();
    QPDFObjectHandle stream_dict = stream.getDict();

    if (stream.isRootMetadata()) {
        is_root_metadata = true;
    }
    bool filter = stream.isDataModified() || m->compress_streams || m->stream_decode_level;
    bool filter_on_write = stream.getFilterOnWrite();
    if (!filter_on_write) {
        QTC::TC("qpdf", "QPDFWriter getFilterOnWrite false");
        filter = false;
    }
    if (filter_on_write && m->compress_streams) {
        // Don't filter if the stream is already compressed with FlateDecode. This way we don't make
        // it worse if the original file used a better Flate algorithm, and we don't spend time and
        // CPU cycles uncompressing and recompressing stuff. This can be overridden with
        // setRecompressFlate(true).
        QPDFObjectHandle filter_obj = stream_dict.getKey("/Filter");
        if (!m->recompress_flate && !stream.isDataModified() && filter_obj.isName() &&
            (filter_obj.getName() == "/FlateDecode" || filter_obj.getName() == "/Fl")) {
            QTC::TC("qpdf", "QPDFWriter not recompressing /FlateDecode");
            filter = false;
        }
    }
    bool normalize = false;
    bool uncompress = false;
    if (filter_on_write && is_root_metadata && (!m->encrypted || !m->encrypt_metadata)) {
        QTC::TC("qpdf", "QPDFWriter not compressing metadata");
        filter = true;
        compress_stream = false;
        uncompress = true;
    } else if (filter_on_write && m->normalize_content && m->normalized_streams.count(old_og)) {
        normalize = true;
        filter = true;
    } else if (filter_on_write && filter && m->compress_streams) {
        compress_stream = true;
        QTC::TC("qpdf", "QPDFWriter compressing uncompressed stream");
    }

    bool filtered = false;
    for (bool first_attempt: {true, false}) {
        PipelinePopper pp_stream_data(this);
        if (stream_data != nullptr) {
            activatePipelineStack(pp_stream_data, *stream_data);
        } else {
            activatePipelineStack(pp_stream_data, true);
        }
        try {
            filtered = stream.pipeStreamData(
                m->pipeline,
                !filter ? 0
                        : ((normalize ? qpdf_ef_normalize : 0) |
                           (compress_stream ? qpdf_ef_compress : 0)),
                !filter ? qpdf_dl_none : (uncompress ? qpdf_dl_all : m->stream_decode_level),
                false,
                first_attempt);
            if (filter && !filtered) {
                // Try again
                filter = false;
                stream.setFilterOnWrite(false);
            } else {
                break;
            }
        } catch (std::runtime_error& e) {
            if (filter && first_attempt) {
                stream.warnIfPossible("error while getting stream data: "s + e.what());
                stream.warnIfPossible("qpdf will attempt to write the damaged stream unchanged");
                filter = false;
                stream.setFilterOnWrite(false);
                continue;
            }
            throw std::runtime_error(
                "error while getting stream data for " + stream.unparse() + ": " + e.what());
        }
        if (stream_data) {
            stream_data->clear();
        }
    }
    if (!filtered) {
        compress_stream = false;
    }
    return filtered;
}